

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O3

void detect(yolo_image *img,ggml_cgraph *gf,yolo_model *model,float thresh,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *labels,vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  yolo_image *im;
  int iVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ggml_tensor *pgVar16;
  ulong uVar17;
  pointer pfVar18;
  long lVar19;
  vector<float,_std::allocator<float>_> *pvVar20;
  pointer pfVar21;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
  __comp;
  pointer pfVar22;
  pointer pdVar23;
  int y1;
  undefined4 uVar24;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> detections_00;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __last;
  vector<float,_std::allocator<float>_> *pvVar25;
  pointer pfVar26;
  uint uVar27;
  uint uVar28;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __i;
  long lVar29;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __last_00;
  int iVar30;
  long lVar31;
  float fVar32;
  double dVar33;
  int iVar35;
  pointer extraout_XMM0_Qb;
  undefined1 auVar34 [16];
  float fVar36;
  int y2;
  float ratio;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  initializer_list<float> __l_02;
  string labelstr;
  vector<detection,_std::allocator<detection>_> detections;
  yolo_image sized;
  yolo_layer yolo23;
  yolo_layer yolo16;
  allocator_type local_209;
  float local_208;
  allocator_type local_201;
  long local_200;
  string local_1f8;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  pointer local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  ulong local_1b0;
  float local_1a4;
  undefined1 local_1a0 [8];
  float local_198;
  pointer local_190;
  pointer local_188;
  pointer pfStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  pointer piStack_160;
  pointer local_158;
  pointer pfStack_150;
  pointer local_148;
  undefined8 uStack_140;
  yolo_image *local_130;
  vector<yolo_image,_std::allocator<yolo_image>_> *local_128;
  undefined8 local_11c;
  undefined4 local_114;
  yolo_image local_110;
  yolo_layer local_e8;
  yolo_layer local_88;
  
  local_1d8 = ZEXT416(0);
  local_1c8 = (pointer)0x0;
  local_208 = thresh;
  local_1b8 = labels;
  local_128 = alphabet;
  letterbox_image(&local_110,img,model->width,model->height);
  uVar14 = ggml_graph_get_tensor(gf,"input");
  pfVar18 = local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = ggml_nbytes(uVar14);
  ggml_backend_tensor_set(uVar14,pfVar18,0,uVar15);
  iVar13 = ggml_backend_graph_compute(model->backend,gf);
  if (iVar13 == 0) {
    pgVar16 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_15");
    local_1a0 = (undefined1  [8])0x400000003;
    local_198 = 7.00649e-45;
    __l._M_len = 3;
    __l._M_array = (iterator)local_1a0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,__l,(allocator_type *)&local_11c);
    local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4329000043070000;
    local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x439f800043ac0000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x4268000042140000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x42a4000042a20000;
    local_e8._0_8_ = 0x4160000041200000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x41d8000041b80000;
    __l_00._M_len = 0xc;
    __l_00._M_array = (iterator)&local_e8;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_1f8,__l_00,&local_209);
    yolo_layer::yolo_layer
              (&local_88,0x50,(vector<int,_std::allocator<int>_> *)local_168,
               (vector<float,_std::allocator<float>_> *)&local_1f8,pgVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) - (long)local_1f8._M_dataplus._M_p
                     );
    }
    if (local_168 != (undefined1  [8])0x0) {
      operator_delete((void *)local_168,(long)local_158 - (long)local_168);
    }
    apply_yolo(&local_88);
    get_yolo_detections(&local_88,(vector<detection,_std::allocator<detection>_> *)local_1d8,img->w,
                        img->h,model->width,model->height,local_208);
    pgVar16 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_22");
    local_11c = 0x100000000;
    local_114 = 2;
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)&local_11c;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1f8,__l_01,(allocator_type *)&local_209);
    local_148 = (pointer)0x4329000043070000;
    uStack_140 = 0x439f800043ac0000;
    local_158 = (pointer)0x4268000042140000;
    pfStack_150 = (pointer)0x42a4000042a20000;
    local_168 = (undefined1  [8])0x4160000041200000;
    piStack_160 = (pointer)0x41d8000041b80000;
    __l_02._M_len = 0xc;
    __l_02._M_array = (iterator)local_168;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_1a0,__l_02,&local_201);
    yolo_layer::yolo_layer
              (&local_e8,0x50,(vector<int,_std::allocator<int>_> *)&local_1f8,
               (vector<float,_std::allocator<float>_> *)local_1a0,pgVar16);
    if (local_1a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a0,(long)local_190 - (long)local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) - (long)local_1f8._M_dataplus._M_p
                     );
    }
    apply_yolo(&local_e8);
    pfVar18 = (pointer)(ulong)(uint)model->height;
    detections_00._M_current = (detection *)local_1d8;
    get_yolo_detections(&local_e8,
                        (vector<detection,_std::allocator<detection>_> *)detections_00._M_current,
                        img->w,img->h,model->width,model->height,local_208);
    local_1c0 = (pointer)(local_e8._0_8_ & 0xffffffff);
    iVar13 = (int)((ulong)(local_1d8._8_8_ - local_1d8._0_8_) >> 4) * -0x55555555;
    uVar28 = iVar13 - 1;
    local_130 = img;
    if (0 < iVar13) {
      iVar13 = 0;
      do {
        uVar14 = local_1d8._0_8_;
        fVar32 = ((pointer)(local_1d8._0_8_ + (long)iVar13 * 0x30))->objectness;
        iVar30 = iVar13;
        if ((fVar32 == 0.0) && (!NAN(fVar32))) {
          local_178._0_4_ = fVar32;
          pdVar23 = (pointer)(local_1d8._0_8_ + (long)iVar13 * 0x30);
          local_200 = CONCAT44(local_200._4_4_,uVar28);
          local_168 = *(undefined1 (*) [8])&pdVar23->bbox;
          piStack_160 = *(pointer *)&(pdVar23->bbox).w;
          pfVar22 = (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pvVar20 = &((pointer)(local_1d8._0_8_ + (long)(int)uVar28 * 0x30))->prob;
          local_188 = (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pfStack_180 = (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pdVar23->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar15 = *(undefined8 *)((long)(pvVar20 + -1) + 8);
          uVar12 = *(undefined8 *)((long)(pvVar20 + -1) + 0x10);
          (pdVar23->bbox).x = (float)(int)uVar15;
          (pdVar23->bbox).y = (float)(int)((ulong)uVar15 >> 0x20);
          (pdVar23->bbox).w = (float)(int)uVar12;
          (pdVar23->bbox).h = (float)(int)((ulong)uVar12 >> 0x20);
          std::vector<float,_std::allocator<float>_>::_M_move_assign(&pdVar23->prob,pvVar20);
          pdVar23->objectness = *(float *)(pvVar20 + 1);
          *(undefined1 (*) [8])((long)(pvVar20 + -1) + 8) = local_168;
          *(pointer *)((long)(pvVar20 + -1) + 0x10) = piStack_160;
          pfVar21 = (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          detections_00._M_current =
               (detection *)
               (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start = local_188;
          (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = pfStack_180;
          (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = pfVar22;
          if (pfVar21 != (pointer)0x0) {
            detections_00._M_current = (detection *)((long)detections_00._M_current - (long)pfVar21)
            ;
            operator_delete(pfVar21,(ulong)detections_00._M_current);
          }
          ((pointer)(uVar14 + (long)(int)uVar28 * 0x30))->objectness = (float)local_178._0_4_;
          uVar28 = (int)local_200 - 1;
          iVar30 = iVar13 + -1;
        }
        iVar13 = iVar30 + 1;
      } while (iVar30 < (int)uVar28);
    }
    if (0 < (int)local_1c0) {
      local_188 = (pointer)(ulong)uVar28;
      lVar19 = (long)(int)uVar28 * 0x30;
      local_178._0_8_ = lVar19;
      local_1b0 = lVar19 - 0x2d0;
      pfVar22 = (pointer)0x0;
      local_200 = CONCAT44(local_200._4_4_,uVar28);
      do {
        uVar14 = local_1d8._0_8_;
        __last._M_current =
             (detection *)
             ((long)&(((detection *)(local_1d8._0_8_ + 0x30))->bbox).x + local_178._0_8_);
        if ((detection *)local_1d8._0_8_ != __last._M_current) {
          lVar29 = (long)__last._M_current - local_1d8._0_8_;
          uVar17 = (lVar29 >> 4) * -0x5555555555555555;
          lVar19 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          __comp._M_comp.k = SUB84(pfVar22,0);
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                    ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                      )local_1d8._0_8_,__last,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,__comp);
          if (lVar29 < 0x301) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                      ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                        )uVar14,__last,__comp);
            detections_00._M_current = __last._M_current;
          }
          else {
            __last_00._M_current = (detection *)(uVar14 + 0x300);
            detections_00._M_current = __last_00._M_current;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                      ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                        )uVar14,__last_00,__comp);
            uVar17 = local_1b0;
            if (__last_00._M_current != __last._M_current) {
              do {
                detections_00._M_current = (detection *)((ulong)pfVar22 & 0xffffffff);
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Val_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                          (__last_00,
                           (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
                            )__comp._M_comp.k);
                __last_00._M_current = __last_00._M_current + 1;
                uVar17 = uVar17 - 0x30;
              } while (uVar17 != 0);
            }
          }
        }
        if (-1 < (int)local_200) {
          pvVar20 = &((pointer)(local_1d8._0_8_ + 0x30))->prob;
          detections_00._M_current = (detection *)0x0;
          pfVar21 = local_188;
          do {
            fVar32 = (((pointer)(local_1d8._0_8_ + detections_00._M_current * 0x30))->prob).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pfVar22];
            if (((fVar32 != 0.0) || (NAN(fVar32))) &&
               ((long)detections_00._M_current < (long)(int)uVar28)) {
              pdVar23 = (pointer)(local_1d8._0_8_ + detections_00._M_current * 0x30);
              uVar1 = (pdVar23->bbox).x;
              uVar5 = (pdVar23->bbox).y;
              uVar2 = (pdVar23->bbox).w;
              uVar6 = (pdVar23->bbox).h;
              pvVar25 = pvVar20;
              pfVar26 = pfVar21;
              do {
                fVar37 = (float)*(undefined8 *)((long)(pvVar25 + -1) + 8);
                fVar38 = (float)((ulong)*(undefined8 *)((long)(pvVar25 + -1) + 8) >> 0x20);
                fVar32 = (float)*(undefined8 *)((long)(pvVar25 + -1) + 0x10);
                fVar36 = (float)((ulong)*(undefined8 *)((long)(pvVar25 + -1) + 0x10) >> 0x20);
                fVar41 = fVar32 * 0.5;
                fVar42 = fVar36 * 0.5;
                auVar44._0_4_ = fVar37 - fVar41;
                auVar44._4_4_ = fVar38 - fVar42;
                auVar44._8_8_ = 0;
                auVar43._4_4_ = (float)uVar5 - (float)uVar6 * 0.5;
                auVar43._0_4_ = (float)uVar1 - (float)uVar2 * 0.5;
                auVar43._8_8_ = 0;
                auVar44 = maxps(auVar43,auVar44);
                auVar39._4_4_ = (float)uVar6 * 0.5 + (float)uVar5;
                auVar39._0_4_ = (float)uVar2 * 0.5 + (float)uVar1;
                auVar39._8_8_ = 0;
                auVar11._4_4_ = fVar42 + fVar38;
                auVar11._0_4_ = fVar41 + fVar37;
                auVar11._8_8_ = 0;
                auVar40 = minps(auVar39,auVar11);
                fVar38 = auVar40._0_4_ - auVar44._0_4_;
                fVar41 = auVar40._4_4_ - auVar44._4_4_;
                iVar13 = -(uint)(fVar38 < 0.0);
                iVar30 = -(uint)(fVar41 < 0.0);
                auVar40._4_4_ = iVar13;
                auVar40._0_4_ = iVar13;
                auVar40._8_4_ = iVar30;
                auVar40._12_4_ = iVar30;
                uVar27 = movmskpd((int)pfVar18,auVar40);
                pfVar18 = (pointer)(ulong)uVar27;
                fVar37 = 0.0;
                if (uVar27 == 0) {
                  fVar37 = fVar41 * fVar38;
                }
                if (0.45 < fVar37 / ((fVar36 * fVar32 + (float)uVar6 * (float)uVar2) - fVar37)) {
                  pfVar18 = (pvVar25->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  pfVar18[(long)pfVar22] = 0.0;
                }
                pvVar25 = pvVar25 + 2;
                pfVar26 = (pointer)((long)pfVar26 - 1);
              } while (pfVar26 != (pointer)0x0);
            }
            detections_00._M_current =
                 (detection *)
                 ((long)&(((_Vector_base<detection,_std::allocator<detection>_> *)
                          &(detections_00._M_current)->bbox)->_M_impl).super__Vector_impl_data.
                         _M_start + 1);
            pfVar21 = (pointer)((long)pfVar21 - 1);
            pvVar20 = pvVar20 + 2;
          } while (detections_00._M_current != (detection *)(ulong)(uVar28 + 1));
        }
        pfVar22 = (pointer)((long)pfVar22 + 1);
      } while (pfVar22 != local_1c0);
    }
    if (0 < (int)((ulong)(local_1d8._8_8_ - local_1d8._0_8_) >> 4) * -0x55555555) {
      local_1b0 = (ulong)((long)(local_1b8->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_1b8->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5;
      local_1a4 = (float)(int)local_1b0;
      lVar19 = 0;
      pdVar23 = (pointer)local_1d8._0_8_;
      do {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_local_buf[0] = '\0';
        pfVar18 = pdVar23[lVar19].prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_200 = lVar19;
        if (0 < (int)((ulong)((long)pdVar23[lVar19].prob.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pfVar18) >> 2)) {
          iVar13 = -1;
          lVar31 = 0;
          lVar29 = 0;
          do {
            if (local_208 < pfVar18[lVar29]) {
              if (iVar13 < 0) {
                std::__cxx11::string::_M_assign((string *)&local_1f8);
                iVar13 = (int)lVar29;
              }
              else {
                std::__cxx11::string::append((char *)&local_1f8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1f8,
                           *(ulong *)((long)&(((local_1b8->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar31));
              }
              detections_00._M_current =
                   *(detection **)
                    ((long)&(((local_1b8->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    lVar31);
              printf("%s: %.0f%%\n",
                     (double)((((pointer)(local_1d8._0_8_ + lVar19 * 0x30))->prob).
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar29] * 100.0));
              pdVar23 = (pointer)local_1d8._0_8_;
            }
            uVar24 = SUB84(detections_00._M_current,0);
            lVar29 = lVar29 + 1;
            pfVar18 = pdVar23[lVar19].prob.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start;
            lVar31 = lVar31 + 0x20;
          } while (lVar29 < (int)((ulong)((long)pdVar23[lVar19].prob.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)pfVar18) >> 2));
          if (-1 < iVar13) {
            pdVar23 = pdVar23 + lVar19;
            fVar32 = ((float)((iVar13 * 0x1e241) % (int)(float)local_1b0) / local_1a4) * 5.0;
            local_178 = ZEXT416((uint)fVar32);
            local_1c0 = (pointer)(double)fVar32;
            local_188 = (pointer)floor((double)local_1c0);
            iVar13 = (int)(double)local_188;
            pfStack_180 = extraout_XMM0_Qb;
            dVar33 = ceil((double)local_1c0);
            im = local_130;
            fVar37 = (float)local_178._0_4_ - (float)(int)(double)local_188;
            fVar32 = 1.0 - fVar37;
            local_198 = *(float *)(&DAT_0011d600 + (long)iVar13 * 0xc) * fVar32 +
                        *(float *)(&DAT_0011d600 + (long)(int)dVar33 * 0xc) * fVar37;
            fVar36 = fVar32 * (float)*(undefined8 *)(&DAT_0011d604 + (long)iVar13 * 0xc) +
                     fVar37 * (float)*(undefined8 *)(&DAT_0011d604 + (long)(int)dVar33 * 0xc);
            fVar37 = fVar32 * (float)((ulong)*(undefined8 *)(&DAT_0011d604 + (long)iVar13 * 0xc) >>
                                     0x20) +
                     fVar37 * (float)((ulong)*(undefined8 *)
                                              (&DAT_0011d604 + (long)(int)dVar33 * 0xc) >> 0x20);
            local_1a0 = (undefined1  [8])CONCAT44(fVar36,fVar37);
            uVar9 = local_130->w;
            uVar10 = local_130->h;
            fVar32 = (float)(int)uVar10;
            uVar3 = (pdVar23->bbox).x;
            uVar7 = (pdVar23->bbox).y;
            uVar4 = (pdVar23->bbox).w;
            uVar8 = (pdVar23->bbox).h;
            iVar13 = (int)(((float)uVar3 - (float)uVar4 * 0.5) * (float)(int)uVar9);
            y1 = (int)(((float)uVar7 - (float)uVar8 * 0.5) * fVar32);
            iVar30 = (int)(((float)uVar4 * 0.5 + (float)uVar3) * (float)(int)uVar9);
            y2 = (int)(((float)uVar8 * 0.5 + (float)uVar7) * fVar32);
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            auVar34._0_4_ = -(uint)(iVar30 < (int)uVar9);
            iVar35 = -(uint)(y2 < (int)uVar10);
            auVar34._4_4_ = auVar34._0_4_;
            auVar34._8_4_ = iVar35;
            auVar34._12_4_ = iVar35;
            uVar28 = movmskpd(uVar24,auVar34);
            if ((uVar28 & 1) == 0) {
              iVar30 = uVar9 + -1;
            }
            if (y1 < 1) {
              y1 = 0;
            }
            if ((uVar28 & 2) == 0) {
              y2 = uVar10 + -1;
            }
            draw_box_width(local_130,iVar13,y1,iVar30,y2,(int)(fVar32 * 0.006),fVar37,fVar36,
                           local_198);
            get_label((yolo_image *)local_168,local_128,&local_1f8,(int)((double)im->h * 0.03));
            uVar28 = y1 + (int)(fVar32 * 0.006);
            detections_00._M_current = (detection *)(ulong)uVar28;
            draw_label(im,uVar28,iVar13,(yolo_image *)local_168,(float *)local_1a0);
            if (local_158 != (pointer)0x0) {
              detections_00._M_current = (detection *)((long)local_148 - (long)local_158);
              operator_delete(local_158,(ulong)detections_00._M_current);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          detections_00._M_current =
               (detection *)
               (CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                         local_1f8.field_2._M_local_buf[0]) + 1);
          operator_delete(local_1f8._M_dataplus._M_p,(ulong)detections_00._M_current);
        }
        lVar19 = local_200 + 1;
        pdVar23 = (pointer)local_1d8._0_8_;
      } while (lVar19 < (int)((ulong)(local_1d8._8_8_ - local_1d8._0_8_) >> 4) * -0x55555555);
    }
    if (local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_88.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    detect();
  }
  if (local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)local_1d8);
  return;
}

Assistant:

void detect(yolo_image & img, struct ggml_cgraph * gf, const yolo_model & model, float thresh, const std::vector<std::string> & labels, const std::vector<yolo_image> & alphabet)
{
    std::vector<detection> detections;
    yolo_image sized = letterbox_image(img, model.width, model.height);
    struct ggml_tensor * input = ggml_graph_get_tensor(gf, "input");
    ggml_backend_tensor_set(input, sized.data.data(), 0, ggml_nbytes(input));

    if (ggml_backend_graph_compute(model.backend, gf) != GGML_STATUS_SUCCESS) {
        fprintf(stderr, "%s: ggml_backend_graph_compute() failed\n", __func__);
        return;
    }

    struct ggml_tensor * layer_15 = ggml_graph_get_tensor(gf, "layer_15");
    yolo_layer yolo16{ 80, {3, 4, 5}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_15};
    apply_yolo(yolo16);
    get_yolo_detections(yolo16, detections, img.w, img.h, model.width, model.height, thresh);

    struct ggml_tensor * layer_22 = ggml_graph_get_tensor(gf, "layer_22");
    yolo_layer yolo23{ 80, {0, 1, 2}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_22};
    apply_yolo(yolo23);
    get_yolo_detections(yolo23, detections, img.w, img.h, model.width, model.height, thresh);

    do_nms_sort(detections, yolo23.classes, .45);
    draw_detections(img, detections, thresh, labels, alphabet);
}